

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O0

void __thiscall tf::Notifier::cancel_wait(Notifier *this,Waiter *w)

{
  Notifier *pNVar1;
  __atomic_base<unsigned_long> _Var2;
  __atomic_base<unsigned_long> local_a8;
  uint64_t state;
  uint64_t epoch;
  Waiter *w_local;
  Notifier *this_local;
  memory_order local_80;
  int local_7c;
  memory_order __b_1;
  Notifier *local_70;
  memory_order local_68;
  int local_64;
  memory_order __b;
  undefined4 local_54;
  Notifier *local_50;
  __atomic_base<unsigned_long> *local_48;
  Notifier *local_40;
  bool local_31;
  Notifier *local_30;
  memory_order local_28;
  undefined4 local_24;
  Notifier *local_20;
  __atomic_base<unsigned_long> *local_18;
  Notifier *local_10;
  
  state = (w->epoch & 0xffffffff00000000) + ((w->epoch >> 0x10 & 0xffff) << 0x20);
  local_64 = 0;
  epoch = (uint64_t)w;
  w_local = (Waiter *)this;
  ___b = this;
  local_68 = std::operator&(relaxed,__memory_order_mask);
  if (local_64 - 1U < 2) {
    local_70 = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  else if (local_64 == 5) {
    local_70 = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  else {
    local_70 = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  local_a8._M_i = (__int_type_conflict)local_70;
  do {
    while ((long)((local_a8._M_i & 0xffffffff00000000) - state) < 0) {
      std::this_thread::yield();
      local_7c = 0;
      ___b_1 = this;
      local_80 = std::operator&(relaxed,__memory_order_mask);
      if (local_7c - 1U < 2) {
        this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_7c == 5) {
        this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
      }
      local_a8._M_i = (__int_type_conflict)this_local;
    }
    if (0 < (long)((local_a8._M_i & 0xffffffff00000000) - state)) {
      return;
    }
    if ((local_a8._M_i & 0xffff0000) == 0) {
      __assert_fail("(state & kWaiterMask) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/notifier.hpp"
                    ,0x9a,"void tf::Notifier::cancel_wait(Waiter *)");
    }
    pNVar1 = (Notifier *)(local_a8._M_i + 0xffff0000);
    local_54 = 0;
    local_50 = pNVar1;
    local_48 = &local_a8;
    local_40 = this;
    local_28 = std::__cmpexch_failure_order(relaxed);
    local_24 = 0;
    if (local_28 - consume < 2) {
      LOCK();
      _Var2._M_i = (this->_state).super___atomic_base<unsigned_long>._M_i;
      local_31 = local_a8._M_i == _Var2._M_i;
      if (local_31) {
        (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)pNVar1;
        _Var2._M_i = local_a8._M_i;
      }
      UNLOCK();
      if (!local_31) {
        local_a8._M_i = _Var2._M_i;
      }
    }
    else if (local_28 == seq_cst) {
      LOCK();
      _Var2._M_i = (this->_state).super___atomic_base<unsigned_long>._M_i;
      local_31 = local_a8._M_i == _Var2._M_i;
      if (local_31) {
        (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)pNVar1;
        _Var2._M_i = local_a8._M_i;
      }
      UNLOCK();
      if (!local_31) {
        local_a8._M_i = _Var2._M_i;
      }
    }
    else {
      LOCK();
      _Var2._M_i = (this->_state).super___atomic_base<unsigned_long>._M_i;
      local_31 = local_a8._M_i == _Var2._M_i;
      if (local_31) {
        (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict)pNVar1;
        _Var2._M_i = local_a8._M_i;
      }
      UNLOCK();
      if (!local_31) {
        local_a8._M_i = _Var2._M_i;
      }
    }
    local_30 = pNVar1;
    local_20 = pNVar1;
    local_18 = &local_a8;
    local_10 = this;
  } while (local_31 == false);
  return;
}

Assistant:

void cancel_wait(Waiter* w) {
    uint64_t epoch =
        (w->epoch & kEpochMask) +
        (((w->epoch & kWaiterMask) >> kWaiterShift) << kEpochShift);
    uint64_t state = _state.load(std::memory_order_relaxed);
    for (;;) {
      if (int64_t((state & kEpochMask) - epoch) < 0) {
        // The preceeding waiter has not decided on its fate. Wait until it
        // calls either cancel_wait or commit_wait, or is notified.
        std::this_thread::yield();
        state = _state.load(std::memory_order_relaxed);
        continue;
      }
      // We've already been notified.
      if (int64_t((state & kEpochMask) - epoch) > 0) return;
      // Remove this thread from prewait counter.
      assert((state & kWaiterMask) != 0);
      if (_state.compare_exchange_weak(state, state - kWaiterInc + kEpochInc,
                                       std::memory_order_relaxed))
        return;
    }
  }